

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::applyAssignmentToScope(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  TreeOp TVar2;
  CheckerVisitor *pCVar3;
  Expr *ref;
  Id *this_00;
  SymbolInfo *info_00;
  CheckerVisitor *__k;
  mapped_type *ppVVar4;
  FunctionDecl *in_RSI;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *in_RDI;
  FunctionInfo *unaff_retaddr;
  Expr *in_stack_00000008;
  SymbolInfo *info;
  ValueRef *v;
  SQChar *name;
  Expr *rhs;
  Expr *lhs;
  undefined8 in_stack_ffffffffffffffc8;
  SymbolKind kind;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *name_00;
  
  kind = (SymbolKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  name_00 = in_RDI;
  pCVar3 = (CheckerVisitor *)BinExpr::lhs((BinExpr *)in_RSI);
  ref = BinExpr::rhs((BinExpr *)in_RSI);
  TVar2 = Node::op((Node *)pCVar3);
  if (TVar2 == TO_ID) {
    this_00 = Node::asId((Node *)pCVar3);
    Id::id(this_00);
    pCVar3 = (CheckerVisitor *)findValueInScopes(pCVar3,(SQChar *)ref);
    if (pCVar3 == (CheckerVisitor *)0x0) {
      info_00 = makeSymbolInfo((CheckerVisitor *)0x0,kind);
      __k = (CheckerVisitor *)makeValueRef(pCVar3,info_00);
      pCVar3 = __k;
      ppVVar4 = std::
                unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
                ::operator[](in_RDI,(key_type *)__k);
      *ppVVar4 = (mapped_type)__k;
      info_00->ownedScope = (VarScope *)in_RDI[1]._M_h._M_bucket_count;
      (info_00->declarator).x = (Id *)0x0;
      if (in_RDI[6]._M_h._M_buckets != (__buckets_ptr)0x0) {
        FunctionInfo::addModifiable(unaff_retaddr,(SQChar *)name_00,in_RSI);
      }
    }
    *(Expr **)&pCVar3->statementSimilarityThreshold = ref;
    pCVar3->functionComplexityThreshold = VRS_EXPRESSION;
    *(uint *)&pCVar3->breakScope = 0;
    *(uint *)((long)&pCVar3->breakScope + 4) = 0;
    *(undefined4 *)
     &(pCVar3->nodeStack).
      super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
    *(ValueBoundKind *)
     &(pCVar3->nodeStack).
      super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ._M_impl.super__Vector_impl_data._M_start = VBK_UNKNOWN;
    *(bool *)((long)&pCVar3->_ctx + 4) = true;
    *(VarScope **)&pCVar3->field_0x20 = (VarScope *)in_RDI[1]._M_h._M_bucket_count;
    *(int32_t *)&pCVar3->_ctx = *(int32_t *)in_RDI[1]._M_h._M_bucket_count;
    bVar1 = isPotentiallyNullable((CheckerVisitor *)info,in_stack_00000008);
    if (bVar1) {
      *(uint *)&pCVar3->breakScope = *(uint *)&pCVar3->breakScope | 2;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::applyAssignmentToScope(const BinExpr *bin) {
  assert(bin->op() == TO_ASSIGN);

  const Expr *lhs = bin->lhs();
  const Expr *rhs = bin->rhs();

  if (lhs->op() != TO_ID)
    return;

  const SQChar *name = lhs->asId()->id();
  ValueRef *v = findValueInScopes(name);

  if (!v) {
    // TODO: what if declarator == null
    SymbolInfo *info = makeSymbolInfo(SK_VAR);
    v = makeValueRef(info);
    currentScope->symbols[name] = v;
    info->ownedScope = currentScope;
    info->declarator.v = nullptr;
    if (currentInfo) {
      currentInfo->addModifiable(name, info->ownedScope->owner);
    }
  }

  v->expression = rhs;
  v->state = VRS_EXPRESSION;
  v->flagsNegative = v->flagsPositive = 0;
  v->lowerBound.kind = v->upperBound.kind = VBK_UNKNOWN;
  v->assigned = true;
  v->lastAssigneeScope = currentScope;
  v->evalIndex = currentScope->evalId;

  if (isPotentiallyNullable(rhs)) {
    v->flagsPositive |= RT_NULL;
  }

}